

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

SteadyTimer __thiscall
miniros::NodeHandle::createSteadyTimer
          (NodeHandle *this,WallDuration *period,SteadyTimerCallback *callback,bool oneshot,
          bool autostart)

{
  SteadyTimerOptions *in_RCX;
  NodeHandle *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SteadyTimerOptions *in_RSI;
  element_type *in_RDI;
  SteadyTimer SVar1;
  SteadyTimerOptions ops;
  
  SteadyTimerOptions::SteadyTimerOptions(in_RCX);
  std::function<void_(const_miniros::SteadyTimerEvent_&)>::operator=
            ((function<void_(const_miniros::SteadyTimerEvent_&)> *)in_RSI,
             (function<void_(const_miniros::SteadyTimerEvent_&)> *)in_RDI);
  createSteadyTimer(in_RDX,in_RSI);
  SteadyTimerOptions::~SteadyTimerOptions(in_RCX);
  SVar1.impl_.super___shared_ptr<miniros::SteadyTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  SVar1.impl_.super___shared_ptr<miniros::SteadyTimer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (SteadyTimer)
         SVar1.impl_.super___shared_ptr<miniros::SteadyTimer::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SteadyTimer NodeHandle::createSteadyTimer(WallDuration period, const SteadyTimerCallback& callback,
                                          bool oneshot, bool autostart) const
{
  SteadyTimerOptions ops;
  ops.period = period;
  ops.callback = callback;
  ops.oneshot = oneshot;
  ops.autostart = autostart;
  return createSteadyTimer(ops);
}